

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_struct_reader
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name,bool is_result)

{
  int *piVar1;
  pointer pptVar2;
  t_field *tfield;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  string *this_00;
  pointer pptVar6;
  int iVar7;
  pointer pptVar8;
  string field_method_prefix;
  string thriftFieldTypeId;
  string field_name_1;
  string field_method_prefix_1;
  string local_90;
  string escaped_tstruct_name;
  string local_50;
  
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  (*(this->super_t_generator)._vptr_t_generator[3])
            (&escaped_tstruct_name,this,CONCAT44(extraout_var,iVar4));
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"func (p *");
  poVar5 = std::operator<<(poVar5,(string *)tstruct_name);
  poVar5 = std::operator<<(poVar5,") ");
  poVar5 = std::operator<<(poVar5,(string *)&this->read_method_name_);
  poVar5 = std::operator<<(poVar5,"(ctx context.Context, iprot thrift.TProtocol) error {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"if _, err := iprot.ReadStructBegin(ctx); err != nil {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)")
  ;
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if ((*pptVar6)->req_ == T_REQUIRED) {
      (*(this->super_t_generator)._vptr_t_generator[3])
                (&field_method_prefix,this,&(*pptVar6)->name_);
      publicize(&thriftFieldTypeId,this,&field_method_prefix,false);
      std::__cxx11::string::~string((string *)&field_method_prefix);
      poVar5 = t_generator::indent(&this->super_t_generator,out);
      poVar5 = std::operator<<(poVar5,"var isset");
      poVar5 = std::operator<<(poVar5,(string *)&thriftFieldTypeId);
      poVar5 = std::operator<<(poVar5," bool = false;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&thriftFieldTypeId);
    }
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent(&this->super_t_generator,out);
  poVar5 = std::operator<<(poVar5,"for {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"if err != nil {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T field %d read error: \", p, fieldId), err)"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  t_generator::indent_abi_cxx11_(&thriftFieldTypeId,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&thriftFieldTypeId);
  poVar5 = std::operator<<(poVar5,"if fieldTypeId == thrift.STOP { break; }");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  thriftFieldTypeId._M_dataplus._M_p = (pointer)&thriftFieldTypeId.field_2;
  thriftFieldTypeId._M_string_length = 0;
  thriftFieldTypeId.field_2._M_local_buf[0] = '\0';
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pptVar8 = pptVar6;
  if (pptVar6 != pptVar2) {
    poVar5 = t_generator::indent(&this->super_t_generator,out);
    poVar5 = std::operator<<(poVar5,"switch fieldId {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  for (; pptVar8 !=
         (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
    iVar4 = (*pptVar8)->key_;
    std::__cxx11::string::string
              ((string *)&field_method_prefix,"ReadField",(allocator *)&field_name_1);
    iVar7 = iVar4;
    if (iVar4 < 0) {
      std::__cxx11::string::append((char *)&field_method_prefix);
      iVar7 = -iVar4;
    }
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"case ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,":");
    this_00 = &::endl_abi_cxx11_;
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    type_to_enum_abi_cxx11_(&field_name_1,(t_go_generator *)this_00,(*pptVar8)->type_);
    std::__cxx11::string::operator=((string *)&thriftFieldTypeId,(string *)&field_name_1);
    std::__cxx11::string::~string((string *)&field_name_1);
    bVar3 = std::operator==(&thriftFieldTypeId,"thrift.BINARY");
    if (bVar3) {
      std::__cxx11::string::assign((char *)&thriftFieldTypeId);
    }
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"if fieldTypeId == ");
    poVar5 = std::operator<<(poVar5,(string *)&thriftFieldTypeId);
    poVar5 = std::operator<<(poVar5," {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"  if err := p.");
    poVar5 = std::operator<<(poVar5,(string *)&field_method_prefix);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    poVar5 = std::operator<<(poVar5,"(ctx, iprot); err != nil {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"    return err");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"  }");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    if ((*pptVar8)->req_ == T_REQUIRED) {
      (*(this->super_t_generator)._vptr_t_generator[3])
                (&field_method_prefix_1,this,&(*pptVar8)->name_);
      publicize(&field_name_1,this,&field_method_prefix_1,false);
      std::__cxx11::string::~string((string *)&field_method_prefix_1);
      t_generator::indent_abi_cxx11_(&field_method_prefix_1,&this->super_t_generator);
      poVar5 = std::operator<<(out,(string *)&field_method_prefix_1);
      poVar5 = std::operator<<(poVar5,"  isset");
      poVar5 = std::operator<<(poVar5,(string *)&field_name_1);
      poVar5 = std::operator<<(poVar5," = true");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&field_method_prefix_1);
      std::__cxx11::string::~string((string *)&field_name_1);
    }
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"} else {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"  if err := iprot.Skip(ctx, fieldTypeId); err != nil {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"    return err");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"  }");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_name_1);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_name_1);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&field_method_prefix);
  }
  if (pptVar6 != pptVar2) {
    t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_method_prefix);
    poVar5 = std::operator<<(poVar5,"default:");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_method_prefix);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"if err := iprot.Skip(ctx, fieldTypeId); err != nil {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"  return err");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  if (pptVar6 != pptVar2) {
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&field_method_prefix);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&field_method_prefix);
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"if err := iprot.ReadFieldEnd(ctx); err != nil {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"  return err");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"if err := iprot.ReadStructEnd(ctx); err != nil {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T read struct end error: \", p), err)"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    if ((*pptVar6)->req_ == T_REQUIRED) {
      (*(this->super_t_generator)._vptr_t_generator[3])(&field_name_1,this,&(*pptVar6)->name_);
      publicize(&field_method_prefix,this,&field_name_1,false);
      std::__cxx11::string::~string((string *)&field_name_1);
      t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
      poVar5 = std::operator<<(out,(string *)&field_name_1);
      poVar5 = std::operator<<(poVar5,"if !isset");
      poVar5 = std::operator<<(poVar5,(string *)&field_method_prefix);
      poVar5 = std::operator<<(poVar5,"{");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&field_name_1);
      t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
      poVar5 = std::operator<<(out,(string *)&field_name_1);
      poVar5 = std::operator<<(poVar5,
                               "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, fmt.Errorf(\"Required field "
                              );
      poVar5 = std::operator<<(poVar5,(string *)&field_method_prefix);
      poVar5 = std::operator<<(poVar5," is not set\"));");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&field_name_1);
      t_generator::indent_abi_cxx11_(&field_name_1,&this->super_t_generator);
      poVar5 = std::operator<<(out,(string *)&field_name_1);
      poVar5 = std::operator<<(poVar5,"}");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&field_name_1);
      std::__cxx11::string::~string((string *)&field_method_prefix);
    }
  }
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"return nil");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&field_method_prefix,&this->super_t_generator);
  poVar5 = std::operator<<(out,(string *)&field_method_prefix);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&field_method_prefix);
  for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    iVar4 = (*((*pptVar6)->type_->super_t_doc)._vptr_t_doc[3])();
    publicize(&field_method_prefix,this,(string *)CONCAT44(extraout_var_00,iVar4),false);
    publicize(&field_name_1,this,&(*pptVar6)->name_,false);
    std::__cxx11::string::string
              ((string *)&field_method_prefix_1,"ReadField",(allocator *)&local_90);
    iVar4 = (*pptVar6)->key_;
    if (iVar4 < 0) {
      std::__cxx11::string::append((char *)&field_method_prefix_1);
      iVar4 = -iVar4;
    }
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&local_90);
    poVar5 = std::operator<<(poVar5,"func (p *");
    poVar5 = std::operator<<(poVar5,(string *)tstruct_name);
    poVar5 = std::operator<<(poVar5,")  ");
    poVar5 = std::operator<<(poVar5,(string *)&field_method_prefix_1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,"(ctx context.Context, iprot thrift.TProtocol) error {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    tfield = *pptVar6;
    std::__cxx11::string::string((string *)&local_50,"p.",(allocator *)&local_90);
    generate_deserialize_field(this,out,tfield,false,&local_50,false,false,false,false);
    std::__cxx11::string::~string((string *)&local_50);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&local_90);
    poVar5 = std::operator<<(poVar5,"  return nil");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar5 = std::operator<<(out,(string *)&local_90);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&field_method_prefix_1);
    std::__cxx11::string::~string((string *)&field_name_1);
    std::__cxx11::string::~string((string *)&field_method_prefix);
  }
  std::__cxx11::string::~string((string *)&thriftFieldTypeId);
  std::__cxx11::string::~string((string *)&escaped_tstruct_name);
  return;
}

Assistant:

void t_go_generator::generate_go_struct_reader(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name,
                                               bool is_result) {
  (void)is_result;
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  string escaped_tstruct_name(escape_string(tstruct->get_name()));
  out << indent() << "func (p *" << tstruct_name << ") " << read_method_name_ << "(ctx context.Context, iprot thrift.TProtocol) error {"
      << endl;
  indent_up();
  out << indent() << "if _, err := iprot.ReadStructBegin(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T read error: \", p), err)"
      << endl;
  out << indent() << "}" << endl << endl;

  // Required variables does not have IsSet functions, so we need tmp vars to check them.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      indent(out) << "var isset" << field_name << " bool = false;" << endl;
    }
  }
  out << endl;

  // Loop over reading in fields
  indent(out) << "for {" << endl;
  indent_up();
  // Read beginning field marker
  out << indent() << "_, fieldTypeId, fieldId, err := iprot.ReadFieldBegin(ctx)" << endl;
  out << indent() << "if err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T field %d read error: \", p, fieldId), err)" << endl;
  out << indent() << "}" << endl;
  // Check for field STOP marker and break
  out << indent() << "if fieldTypeId == thrift.STOP { break; }" << endl;

  string thriftFieldTypeId;
  // Generate deserialization code for known cases
  int32_t field_id = -1;

  // Switch statement on the field we are reading, false if no fields present
  bool have_switch = !fields.empty();
  if (have_switch) {
    indent(out) << "switch fieldId {" << endl;
  }

  // All the fields we know
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_id = (*f_iter)->get_key();

    // if negative id, ensure we generate a valid method name
    string field_method_prefix("ReadField");
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "case " << field_id << ":" << endl;
    indent_up();
    thriftFieldTypeId = type_to_enum((*f_iter)->get_type());

    if (thriftFieldTypeId == "thrift.BINARY") {
      thriftFieldTypeId = "thrift.STRING";
    }

    out << indent() << "if fieldTypeId == " << thriftFieldTypeId << " {" << endl;
    out << indent() << "  if err := p." << field_method_prefix << field_method_suffix << "(ctx, iprot); err != nil {"
        << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;

    // Mark required field as read
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "  isset" << field_name << " = true" << endl;
    }

    out << indent() << "} else {" << endl;
    out << indent() << "  if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
    out << indent() << "    return err" << endl;
    out << indent() << "  }" << endl;
    out << indent() << "}" << endl;


    indent_down();
  }

  // Begin switch default case
  if (have_switch) {
    out << indent() << "default:" << endl;
    indent_up();
  }

  // Skip unknown fields in either case
  out << indent() << "if err := iprot.Skip(ctx, fieldTypeId); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;

  // End switch default case
  if (have_switch) {
    indent_down();
    out << indent() << "}" << endl;
  }

  // Read field end marker
  out << indent() << "if err := iprot.ReadFieldEnd(ctx); err != nil {" << endl;
  out << indent() << "  return err" << endl;
  out << indent() << "}" << endl;
  indent_down();
  out << indent() << "}" << endl;
  out << indent() << "if err := iprot.ReadStructEnd(ctx); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf("
                     "\"%T read struct end error: \", p), err)" << endl;
  out << indent() << "}" << endl;

  // Return error if any required fields are missing.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      const string field_name(publicize(escape_string((*f_iter)->get_name())));
      out << indent() << "if !isset" << field_name << "{" << endl;
      out << indent() << "  return thrift.NewTProtocolExceptionWithType(thrift.INVALID_DATA, "
                         "fmt.Errorf(\"Required field " << field_name << " is not set\"));" << endl;
      out << indent() << "}" << endl;
    }
  }

  out << indent() << "return nil" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    string field_type_name(publicize((*f_iter)->get_type()->get_name()));
    string field_name(publicize((*f_iter)->get_name()));
    string field_method_prefix("ReadField");
    int32_t field_id = (*f_iter)->get_key();
    int32_t field_method_suffix = field_id;

    if (field_method_suffix < 0) {
      field_method_prefix += "_";
      field_method_suffix *= -1;
    }

    out << indent() << "func (p *" << tstruct_name << ")  " << field_method_prefix << field_method_suffix
        << "(ctx context.Context, iprot thrift.TProtocol) error {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, false, "p.");
    indent_down();
    out << indent() << "  return nil" << endl;
    out << indent() << "}" << endl << endl;
  }
}